

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void Curl_free_request_state(Curl_easy *data)

{
  Curl_easy *data_local;
  
  (*Curl_cfree)((data->req).p.file);
  (data->req).p.file = (FILEPROTO *)0x0;
  (*Curl_cfree)((data->req).newurl);
  (data->req).newurl = (char *)0x0;
  if ((data->req).doh != (dohdata *)0x0) {
    Curl_close(&((data->req).doh)->probe[0].easy);
    Curl_close(&((data->req).doh)->probe[1].easy);
  }
  Curl_client_cleanup(data);
  return;
}

Assistant:

void Curl_free_request_state(struct Curl_easy *data)
{
  Curl_safefree(data->req.p.http);
  Curl_safefree(data->req.newurl);
#ifndef CURL_DISABLE_DOH
  if(data->req.doh) {
    Curl_close(&data->req.doh->probe[0].easy);
    Curl_close(&data->req.doh->probe[1].easy);
  }
#endif
  Curl_client_cleanup(data);
}